

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation
          (AbstractScrollAreaPrivate *this)

{
  AbstractScrollAreaPrivate *this_local;
  
  QTimer::stop();
  this->horIndicator->needPaint = false;
  this->vertIndicator->needPaint = false;
  this->horIndicator->animate = false;
  this->vertIndicator->animate = false;
  QWidget::update();
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::stopScrollIndicatorsAnimation()
{
	animationTimer->stop();
	horIndicator->needPaint = false;
	vertIndicator->needPaint = false;
	horIndicator->animate = false;
	vertIndicator->animate = false;
	horIndicator->update();
	vertIndicator->update();
}